

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomCapsule>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               GeomCapsule *capsule,string *warn,string *err,PrimReconstructOptions *options)

{
  Property *prop;
  size_type *psVar1;
  _Base_ptr __k;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  undefined7 extraout_var;
  ostream *poVar8;
  long *plVar9;
  const_iterator cVar10;
  mapped_type *pmVar11;
  _Base_ptr p_Var12;
  string *psVar13;
  Attribute *attr;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  undefined1 local_2e0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2c8;
  string local_2b8;
  string *local_298;
  TypedAttributeWithFallback<tinyusdz::Axis> *local_290;
  string *local_288;
  undefined8 local_280;
  long *local_278 [2];
  long local_268 [2];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_258;
  TypedAttributeWithFallback<tinyusdz::Animatable<double>_> *local_250;
  TypedAttributeWithFallback<tinyusdz::Animatable<double>_> *local_248;
  _Base_ptr local_240;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  string local_208;
  string local_1e8;
  _Any_data local_1c8;
  code *local_1b8;
  code *pcStack_1b0;
  undefined1 local_1a8 [16];
  code *local_198;
  code *pcStack_190;
  ios_base local_138 [264];
  
  local_238._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_238._M_impl.super__Rb_tree_header._M_header;
  local_238._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_238._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_280 = 0;
  local_238._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_298 = err;
  local_288 = warn;
  local_238._M_impl.super__Rb_tree_header._M_header._M_right =
       local_238._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar5 = anon_unknown_0::ReconstructGPrimProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_238,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,&capsule->super_GPrim,warn,err,options->strict_allowedToken_check
                    );
  if (bVar5) {
    p_Var12 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_240 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_280 = CONCAT71(extraout_var,p_Var12 == local_240);
    if (p_Var12 != local_240) {
      local_248 = &capsule->radius;
      local_250 = &capsule->height;
      local_258 = &(capsule->super_GPrim).props;
      local_290 = &capsule->axis;
      do {
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e8,*(long *)(p_Var12 + 1),
                   (long)&(p_Var12[1]._M_parent)->_M_color + *(long *)(p_Var12 + 1));
        prop = (Property *)(p_Var12 + 2);
        local_1a8._0_8_ = &local_198;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"radius","");
        psVar13 = (string *)local_1a8;
        anon_unknown_0::ParseTypedAttribute<double>
                  ((ParseResult *)local_2e0,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238,&local_1e8,prop,(string *)local_1a8,local_248);
        if ((code **)local_1a8._0_8_ != &local_198) {
          operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        iVar6 = 0;
        if ((local_2e0._0_8_ & 0xfffffffd) == 0) {
          iVar6 = 3;
LAB_00214568:
          bVar5 = false;
        }
        else {
          bVar5 = true;
          if (local_2e0._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar8 = (ostream *)::std::ostream::operator<<((string *)local_1a8,0xde9);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
            local_278[0] = local_268;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_278,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[7],std::__cxx11::string>
                      (&local_2b8,(fmt *)local_278,(string *)0x3bc28e,(char (*) [7])(local_2e0 + 8),
                       psVar13);
            poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_2b8._M_dataplus._M_p,
                                local_2b8._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            paVar3 = &local_2b8.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != paVar3) {
              operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1
                             );
            }
            psVar13 = local_298;
            if (local_278[0] != local_268) {
              operator_delete(local_278[0],local_268[0] + 1);
            }
            if (psVar13 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar9 = (long *)::std::__cxx11::string::_M_append
                                         ((char *)local_278,(ulong)(psVar13->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_2b8.field_2._M_allocated_capacity = *psVar1;
                local_2b8.field_2._8_8_ = plVar9[3];
                local_2b8._M_dataplus._M_p = (pointer)paVar3;
              }
              else {
                local_2b8.field_2._M_allocated_capacity = *psVar1;
                local_2b8._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_2b8._M_string_length = plVar9[1];
              *plVar9 = (long)psVar1;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)psVar13,(string *)&local_2b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8._M_dataplus._M_p != paVar3) {
                operator_delete(local_2b8._M_dataplus._M_p,
                                local_2b8.field_2._M_allocated_capacity + 1);
              }
              if (local_278[0] != local_268) {
                operator_delete(local_278[0],local_268[0] + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base(local_138);
            iVar6 = 1;
            goto LAB_00214568;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._8_8_ != &aStack_2c8) {
          operator_delete((void *)local_2e0._8_8_,aStack_2c8._M_allocated_capacity + 1);
        }
        if (bVar5) {
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_208,*(long *)(p_Var12 + 1),
                     (long)&(p_Var12[1]._M_parent)->_M_color + *(long *)(p_Var12 + 1));
          local_1a8._0_8_ = &local_198;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"height","");
          psVar13 = (string *)local_1a8;
          anon_unknown_0::ParseTypedAttribute<double>
                    ((ParseResult *)local_2e0,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_238,&local_208,prop,(string *)local_1a8,local_250);
          if ((code **)local_1a8._0_8_ != &local_198) {
            operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          iVar6 = 0;
          if ((local_2e0._0_8_ & 0xfffffffd) == 0) {
            iVar6 = 3;
LAB_00214870:
            bVar5 = false;
          }
          else {
            bVar5 = true;
            if (local_2e0._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar8 = (ostream *)::std::ostream::operator<<((string *)local_1a8,0xdea);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
              local_278[0] = local_268;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_278,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[7],std::__cxx11::string>
                        (&local_2b8,(fmt *)local_278,(string *)0x3bc2c1,
                         (char (*) [7])(local_2e0 + 8),psVar13);
              poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,local_2b8._M_dataplus._M_p,
                                  local_2b8._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
              paVar3 = &local_2b8.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8._M_dataplus._M_p != paVar3) {
                operator_delete(local_2b8._M_dataplus._M_p,
                                local_2b8.field_2._M_allocated_capacity + 1);
              }
              psVar13 = local_298;
              if (local_278[0] != local_268) {
                operator_delete(local_278[0],local_268[0] + 1);
              }
              if (psVar13 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar9 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)local_278,(ulong)(psVar13->_M_dataplus)._M_p);
                psVar1 = (size_type *)(plVar9 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar9 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_2b8.field_2._M_allocated_capacity = *psVar1;
                  local_2b8.field_2._8_8_ = plVar9[3];
                  local_2b8._M_dataplus._M_p = (pointer)paVar3;
                }
                else {
                  local_2b8.field_2._M_allocated_capacity = *psVar1;
                  local_2b8._M_dataplus._M_p = (pointer)*plVar9;
                }
                local_2b8._M_string_length = plVar9[1];
                *plVar9 = (long)psVar1;
                plVar9[1] = 0;
                *(undefined1 *)(plVar9 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)psVar13,(string *)&local_2b8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b8._M_dataplus._M_p != paVar3) {
                  operator_delete(local_2b8._M_dataplus._M_p,
                                  local_2b8.field_2._M_allocated_capacity + 1);
                }
                if (local_278[0] != local_268) {
                  operator_delete(local_278[0],local_268[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              ::std::ios_base::~ios_base(local_138);
              iVar6 = 1;
              goto LAB_00214870;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._8_8_ != &aStack_2c8) {
            operator_delete((void *)local_2e0._8_8_,aStack_2c8._M_allocated_capacity + 1);
          }
          if (bVar5) {
            __k = p_Var12 + 1;
            iVar6 = ::std::__cxx11::string::compare((char *)__k);
            if (iVar6 == 0) {
              local_1a8._0_8_ = &local_198;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"axis","");
              cVar10 = ::std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_238,(string *)local_1a8);
              if ((code **)local_1a8._0_8_ != &local_198) {
                operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
              }
              iVar6 = 3;
              if ((_Rb_tree_header *)cVar10._M_node == &local_238._M_impl.super__Rb_tree_header) {
                if (((ulong)p_Var12[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                  local_1a8._0_8_ = &local_198;
                  local_1a8._8_8_ = 0;
                  local_198 = (code *)((ulong)local_198 & 0xffffffffffffff00);
                }
                else {
                  Attribute::type_name_abi_cxx11_((string *)local_1a8,(Attribute *)prop);
                }
                psVar1 = (size_type *)(local_2e0 + 0x10);
                local_2e0._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x5;
                local_2e0._16_6_ = 0x6e656b6f74;
                local_2e0._0_8_ = psVar1;
                if (((local_1a8._8_8_ == 5) &&
                    (iVar7 = bcmp((void *)local_1a8._0_8_,psVar1,5), iVar7 == 0)) &&
                   (uVar4 = *(uint *)((long)&p_Var12[0x17]._M_parent + 4), uVar4 < 2)) {
                  if ((code **)local_1a8._0_8_ != &local_198) {
                    operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
                  }
                  if (uVar4 == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"[warn]",6);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"ReconstructPrim",0xf);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"():",3);
                    poVar8 = (ostream *)::std::ostream::operator<<((string *)local_1a8,0xdeb);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"No value assigned to `",0x16);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"axis",4);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"` token attribute. Set default token value.",
                               0x2b);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"\n",1);
                    if (local_288 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      plVar9 = (long *)::std::__cxx11::string::_M_append
                                                 ((char *)&local_2b8,
                                                  (ulong)(local_298->_M_dataplus)._M_p);
                      psVar2 = (size_type *)(plVar9 + 2);
                      if ((size_type *)*plVar9 == psVar2) {
                        local_2e0._16_8_ = *psVar2;
                        aStack_2c8._M_allocated_capacity = plVar9[3];
                        local_2e0._0_8_ = psVar1;
                      }
                      else {
                        local_2e0._16_8_ = *psVar2;
                        local_2e0._0_8_ = (size_type *)*plVar9;
                      }
                      local_2e0._8_8_ = plVar9[1];
                      *plVar9 = (long)psVar2;
                      plVar9[1] = 0;
                      *(undefined1 *)(plVar9 + 2) = 0;
                      ::std::__cxx11::string::operator=((string *)local_288,(string *)local_2e0);
                      if ((size_type *)local_2e0._0_8_ != psVar1) {
                        operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                        operator_delete(local_2b8._M_dataplus._M_p,
                                        local_2b8.field_2._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                    ::std::ios_base::~ios_base(local_138);
                    AttrMetas::operator=(&local_290->_metas,(AttrMetas *)(p_Var12 + 7));
                    local_1a8._0_8_ = &local_198;
                    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"axis","")
                    ;
                    ::std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)&local_238,(string *)local_1a8);
                    if ((code **)local_1a8._0_8_ != &local_198) {
                      operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
                    }
                    goto LAB_00215001;
                  }
                }
                else if ((code **)local_1a8._0_8_ != &local_198) {
                  operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
                }
                local_1a8._8_8_ = 0;
                local_1a8._0_8_ = AxisEnumHandler;
                pcStack_190 = ::std::
                              _Function_handler<nonstd::expected_lite::expected<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              ::_M_invoke;
                local_198 = ::std::
                            _Function_handler<nonstd::expected_lite::expected<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            ::_M_manager;
                local_2e0._0_8_ = psVar1;
                ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"axis","");
                bVar5 = options->strict_allowedToken_check;
                local_1b8 = (code *)0x0;
                pcStack_1b0 = (code *)0x0;
                local_1c8._M_unused._M_object = (void *)0x0;
                local_1c8._8_8_ = 0;
                if (local_198 != (code *)0x0) {
                  (*local_198)(&local_1c8,(string *)local_1a8,2);
                  local_1b8 = local_198;
                  pcStack_1b0 = pcStack_190;
                }
                bVar5 = ParseUniformEnumProperty<tinyusdz::Axis,tinyusdz::Axis>
                                  ((string *)local_2e0,bVar5,
                                   (EnumHandlerFun<tinyusdz::Axis> *)&local_1c8,(Attribute *)prop,
                                   local_290,local_288,local_298);
                if (local_1b8 != (code *)0x0) {
                  (*local_1b8)(&local_1c8,&local_1c8,__destroy_functor);
                }
                if ((size_type *)local_2e0._0_8_ != psVar1) {
                  operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
                }
                iVar6 = 1;
                if (bVar5) {
                  AttrMetas::operator=(&local_290->_metas,(AttrMetas *)(p_Var12 + 7));
                  local_2e0._0_8_ = psVar1;
                  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"axis","");
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&local_238,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2e0);
                  if ((size_type *)local_2e0._0_8_ != psVar1) {
                    operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
                  }
                  iVar6 = 3;
                }
                if (local_198 != (code *)0x0) {
                  (*local_198)((string *)local_1a8,(string *)local_1a8,3);
                }
              }
            }
            else {
              cVar10 = ::std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_238,(key_type *)__k);
              if ((_Rb_tree_header *)cVar10._M_node == &local_238._M_impl.super__Rb_tree_header) {
                pmVar11 = ::std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                          ::operator[](local_258,(key_type *)__k);
                ::std::__cxx11::string::_M_assign((string *)pmVar11);
                (pmVar11->_attrib)._varying_authored = (bool)p_Var12[3].field_0x4;
                (pmVar11->_attrib)._variability = p_Var12[3]._M_color;
                ::std::__cxx11::string::_M_assign((string *)&(pmVar11->_attrib)._type_name);
                linb::any::operator=((any *)&(pmVar11->_attrib)._var,(any *)&p_Var12[4]._M_parent);
                (pmVar11->_attrib)._var._blocked = SUB41(p_Var12[5]._M_color,0);
                ::std::
                vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                             *)&(pmVar11->_attrib)._var._ts,
                            (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                             *)&p_Var12[5]._M_parent);
                (pmVar11->_attrib)._var._ts._dirty = SUB41(p_Var12[6]._M_color,0);
                std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          (&(pmVar11->_attrib)._paths,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &p_Var12[6]._M_parent);
                AttrMetas::operator=(&(pmVar11->_attrib)._metas,(AttrMetas *)(p_Var12 + 7));
                *(_Base_ptr *)&pmVar11->_listOpQual = p_Var12[0x17]._M_parent;
                (pmVar11->_rel).type = *(Type *)&p_Var12[0x17]._M_left;
                Path::operator=(&(pmVar11->_rel).targetPath,(Path *)&p_Var12[0x17]._M_right);
                std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          (&(pmVar11->_rel).targetPathVector,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &p_Var12[0x1e]._M_parent);
                (pmVar11->_rel).listOpQual = p_Var12[0x1f]._M_color;
                AttrMetas::operator=(&(pmVar11->_rel)._metas,(AttrMetas *)&p_Var12[0x1f]._M_parent);
                (pmVar11->_rel)._varying_authored = *(bool *)&p_Var12[0x2f]._M_left;
                ::std::__cxx11::string::_M_assign((string *)&pmVar11->_prop_value_type_name);
                pmVar11->_has_custom = *(bool *)&p_Var12[0x30]._M_right;
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_238,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k)
                ;
              }
              cVar10 = ::std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_238,(key_type *)__k);
              iVar6 = 0;
              if ((_Rb_tree_header *)cVar10._M_node == &local_238._M_impl.super__Rb_tree_header) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
                poVar8 = (ostream *)::std::ostream::operator<<((string *)local_1a8,0xded);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_2e0,"Unsupported/unimplemented property: ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__k);
                poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1a8,(char *)local_2e0._0_8_,local_2e0._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                psVar1 = (size_type *)(local_2e0 + 0x10);
                if ((size_type *)local_2e0._0_8_ != psVar1) {
                  operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
                }
                psVar13 = local_298;
                if (local_298 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar9 = (long *)::std::__cxx11::string::_M_append
                                             ((char *)&local_2b8,(ulong)(psVar13->_M_dataplus)._M_p)
                  ;
                  psVar2 = (size_type *)(plVar9 + 2);
                  if ((size_type *)*plVar9 == psVar2) {
                    local_2e0._16_8_ = *psVar2;
                    aStack_2c8._M_allocated_capacity = plVar9[3];
                    local_2e0._0_8_ = psVar1;
                  }
                  else {
                    local_2e0._16_8_ = *psVar2;
                    local_2e0._0_8_ = (size_type *)*plVar9;
                  }
                  local_2e0._8_8_ = plVar9[1];
                  *plVar9 = (long)psVar2;
                  plVar9[1] = 0;
                  *(undefined1 *)(plVar9 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)psVar13,(string *)local_2e0);
                  if ((size_type *)local_2e0._0_8_ != psVar1) {
                    operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                    operator_delete(local_2b8._M_dataplus._M_p,
                                    local_2b8.field_2._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                ::std::ios_base::~ios_base(local_138);
                iVar6 = 1;
              }
            }
          }
        }
LAB_00215001:
        if ((iVar6 != 3) && (iVar6 != 0)) break;
        p_Var12 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var12);
        local_280 = CONCAT71((int7)((ulong)p_Var12 >> 8),p_Var12 == local_240);
      } while (p_Var12 != local_240);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_238,(_Link_type)local_238._M_impl.super__Rb_tree_header._M_header._M_parent);
  return (bool)((byte)local_280 & 1);
}

Assistant:

bool ReconstructPrim<GeomCapsule>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomCapsule *capsule,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)warn;
  (void)references;
  (void)options;

  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, capsule, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "radius", GeomCapsule, capsule->radius)
    PARSE_TYPED_ATTRIBUTE(table, prop, "height", GeomCapsule, capsule->height)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "axis", Axis, AxisEnumHandler, GeomCapsule, capsule->axis, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, GeomCapsule, capsule->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

  return true;
}